

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O1

void OP_gcref(void)

{
  LispPTR LVar1;
  
  LVar1 = 0;
  if ((-1 < *(short *)((ulong)(MachineState.tosvalue >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
     (LVar1 = 0, *GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      LVar1 = rec_htfind(MachineState.tosvalue,
                         (uint)*(byte *)((ulong)(MachineState.currentpc + 1) ^ 3));
    }
    else {
      LVar1 = htfind(MachineState.tosvalue,(uint)*(byte *)((ulong)(MachineState.currentpc + 1) ^ 3))
      ;
    }
  }
  MachineState.tosvalue = LVar1;
  MachineState.currentpc = MachineState.currentpc + 2;
  return;
}

Assistant:

void OP_gcref(void) {
#ifdef TRACE
  printPC();
  printf("TRACE:OP_gcref()\n");
#endif
  GCLOOKUPV(TopOfStack, Get_code_BYTE(PC + 1), TopOfStack);
  PC += 2;
  return;
}